

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O2

void brotli::WriteHuffmanTree
               (uint8_t *depth,size_t length,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *tree,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *extra_bits_data)

{
  uint8_t value;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t previous_value;
  ulong uVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t i_1;
  ulong uVar11;
  bool bVar12;
  
  sVar9 = length;
  do {
    sVar10 = sVar9;
    if (sVar10 == 0) {
      sVar10 = 0;
      break;
    }
    sVar9 = sVar10 - 1;
  } while (depth[sVar10 - 1] == '\0');
  if (length < 0x33) {
    bVar12 = false;
    bVar1 = false;
  }
  else {
    uVar11 = 1;
    uVar3 = 0;
    uVar4 = 0;
    uVar2 = uVar11;
    uVar6 = uVar11;
    for (uVar7 = 0; uVar7 <= sVar10 && sVar10 - uVar7 != 0; uVar7 = uVar7 + uVar8) {
      for (uVar5 = uVar11;
          (uVar8 = sVar10 - uVar7, uVar7 + uVar5 < sVar10 &&
          (uVar8 = uVar5, depth[uVar5 + uVar7] == depth[uVar7])); uVar5 = uVar5 + 1) {
      }
      bVar12 = depth[uVar7] == '\0';
      uVar2 = uVar2 + (bVar12 && 2 < uVar8);
      uVar5 = 0;
      if (bVar12 && 2 < uVar8) {
        uVar5 = uVar8;
      }
      uVar4 = uVar4 + uVar5;
      uVar5 = 0;
      if (3 < uVar8 && !bVar12) {
        uVar5 = uVar8;
      }
      uVar3 = uVar3 + uVar5;
      uVar6 = uVar6 + (3 < uVar8 && !bVar12);
    }
    bVar12 = uVar6 * 2 < uVar3;
    bVar1 = uVar2 * 2 < uVar4;
  }
  previous_value = '\b';
  uVar11 = 0;
  do {
    if (sVar10 <= uVar11) {
      return;
    }
    value = depth[uVar11];
    sVar9 = 1;
    if (value == '\0') {
      if (bVar1) goto LAB_0017c56b;
LAB_0017c5a1:
      WriteHuffmanTreeRepetitionsZeros(sVar9,tree,extra_bits_data);
    }
    else {
      if (bVar12) {
LAB_0017c56b:
        for (; (uVar11 + sVar9 < sVar10 && (depth[sVar9 + uVar11] == value)); sVar9 = sVar9 + 1) {
        }
        if (value == '\0') goto LAB_0017c5a1;
      }
      WriteHuffmanTreeRepetitions(previous_value,value,sVar9,tree,extra_bits_data);
      previous_value = value;
    }
    uVar11 = uVar11 + sVar9;
  } while( true );
}

Assistant:

void WriteHuffmanTree(const uint8_t* depth,
                      size_t length,
                      std::vector<uint8_t> *tree,
                      std::vector<uint8_t> *extra_bits_data) {
  uint8_t previous_value = 8;

  // Throw away trailing zeros.
  size_t new_length = length;
  for (size_t i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  // First gather statistics on if it is a good idea to do rle.
  bool use_rle_for_non_zero = false;
  bool use_rle_for_zero = false;
  if (length > 50) {
    // Find rle coding for longer codes.
    // Shorter codes seem not to benefit from rle.
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  // Actual rle coding.
  for (size_t i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      for (size_t k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      WriteHuffmanTreeRepetitionsZeros(reps, tree, extra_bits_data);
    } else {
      WriteHuffmanTreeRepetitions(previous_value,
                                  value, reps, tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}